

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::add_fallback_format(SwapchainBuilder *this,VkSurfaceFormatKHR format)

{
  pointer *ppVVar1;
  iterator __position;
  VkSurfaceFormatKHR local_10;
  
  __position._M_current =
       (this->info).desired_formats.
       super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->info).desired_formats.
      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_10 = format;
    std::vector<VkSurfaceFormatKHR,std::allocator<VkSurfaceFormatKHR>>::
    _M_realloc_insert<VkSurfaceFormatKHR_const&>
              ((vector<VkSurfaceFormatKHR,std::allocator<VkSurfaceFormatKHR>> *)
               &(this->info).desired_formats,__position,&local_10);
  }
  else {
    *__position._M_current = format;
    ppVVar1 = &(this->info).desired_formats.
               super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::add_fallback_format(VkSurfaceFormatKHR format) {
    info.desired_formats.push_back(format);
    return *this;
}